

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SRF02.cpp
# Opt level: O3

void * SRF02Thread(void *pParam)

{
  ulong uVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  timeval tv;
  bool bVar6;
  bool bVar7;
  double dVar8;
  int iVar9;
  size_t sVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  int i;
  long lVar14;
  ulong uVar15;
  char *__s;
  double *pdVar16;
  char *pcVar17;
  double *pdVar18;
  long lVar19;
  byte bVar20;
  double tab_values [3];
  double distances [16];
  CHRONO chrono_period;
  double angles [16];
  double distances3 [16];
  double distances2 [16];
  double distances1 [16];
  SRF02 srf02;
  char szTemp [256];
  char szCfgFilePath [256];
  char szSaveFilePath [256];
  timespec local_d48;
  double local_d38;
  double local_d30;
  int local_d24;
  long local_d20;
  timeval local_d18;
  double local_d08 [17];
  timespec local_c80;
  double local_c70;
  double dStack_c68;
  double local_c60;
  double dStack_c58;
  timespec local_c50;
  int local_c40;
  double local_c38;
  double dStack_c30;
  double local_c28;
  double dStack_c20;
  undefined8 local_c18;
  undefined8 uStack_c10;
  undefined8 local_c08;
  undefined8 uStack_c00;
  undefined8 local_bf8;
  undefined8 uStack_bf0;
  undefined8 local_be8;
  undefined8 uStack_be0;
  undefined8 local_bd8;
  undefined8 uStack_bd0;
  undefined8 local_bc8;
  undefined8 uStack_bc0;
  double local_bb8 [48];
  SRF02 local_a38;
  char local_338 [256];
  char local_238 [256];
  char local_138 [264];
  
  bVar20 = 0;
  builtin_strncpy(local_238,"SRF020.txt",0xb);
  memset(&local_a38,0,0x700);
  iVar9 = clock_getres(4,&local_c50);
  if ((iVar9 == 0) && (iVar9 = clock_gettime(4,&local_c80), iVar9 == 0)) {
    local_c40 = 0;
    local_c70 = 0.0;
    dStack_c68 = 0.0;
    local_c60 = 0.0;
    dStack_c58 = 0.0;
  }
  lVar19 = 0x32;
  __s = "SRF02 disconnection failed.";
  bVar6 = false;
  local_d24 = 0;
  do {
    bVar6 = !bVar6;
    local_d20 = lVar19;
    while( true ) {
      if (local_c40 == 0) {
        clock_gettime(4,&local_d48);
        local_c70 = (double)local_d48.tv_sec;
        dStack_c68 = (double)local_d48.tv_nsec;
        local_d48.tv_sec =
             ((local_d48.tv_sec + (long)local_c60) - local_c80.tv_sec) +
             (local_d48.tv_nsec + (long)dStack_c58) / 1000000000;
        local_d48.tv_nsec = (local_d48.tv_nsec + (long)dStack_c58) % 1000000000 - local_c80.tv_nsec;
        if (local_d48.tv_nsec < 0) {
          local_d48.tv_sec = local_d48.tv_sec + ~((ulong)-local_d48.tv_nsec / 1000000000);
          local_d48.tv_nsec =
               local_d48.tv_nsec + 1000000000 +
               ((ulong)-local_d48.tv_nsec / 1000000000) * 1000000000;
        }
        local_c60 = (double)local_d48.tv_sec;
        dStack_c58 = (double)local_d48.tv_nsec;
      }
      iVar9 = clock_getres(4,&local_c50);
      if ((iVar9 == 0) && (iVar9 = clock_gettime(4,&local_c80), iVar9 == 0)) {
        local_c40 = 0;
        local_c60 = 0.0;
        dStack_c58 = 0.0;
        local_c70 = 0.0;
        dStack_c68 = 0.0;
      }
      if (bPauseSRF02 == 0) break;
      if (!bVar6) {
        puts("SRF02 paused.");
        iVar9 = close((int)local_a38.I2CBus);
        pcVar17 = "SRF02 disconnection failed.";
        if (iVar9 == 0) {
          pcVar17 = "SRF02 disconnected.";
        }
        puts(pcVar17);
      }
      if (bExit != 0) goto LAB_0019d6c6;
      local_d48.tv_sec = 0;
      local_d48.tv_nsec = 100000000;
LAB_0019cec1:
      nanosleep(&local_d48,(timespec *)0x0);
      bVar6 = true;
    }
    if (bRestartSRF02 == 0) {
      if (bVar6) goto LAB_0019cf13;
      if (local_a38.bParallel == 0) {
        iVar9 = Get5TelemetersSRF02(&local_a38,local_d08,local_d08 + 1,local_d08 + 2,local_d08 + 3,
                                    local_d08 + 4,10);
        if (iVar9 != 0) goto LAB_0019ce8a;
        local_d48.tv_nsec = 10000000;
      }
      else {
        iVar9 = Get5TelemetersParallelSRF02
                          (&local_a38,local_d08,local_d08 + 1,local_d08 + 2,local_d08 + 3,
                           local_d08 + 4);
        if (iVar9 != 0) {
LAB_0019ce8a:
          puts("Connection to a SRF02 lost.");
          iVar9 = close((int)local_a38.I2CBus);
          pcVar17 = "SRF02 disconnection failed.";
          if (iVar9 == 0) {
            pcVar17 = "SRF02 disconnected.";
          }
          puts(pcVar17);
          local_d48.tv_sec = (long)((int)lVar19 / 1000);
          local_d48.tv_nsec = (long)((((int)lVar19 * 1000) % 1000000) * 1000);
          goto LAB_0019cec1;
        }
        local_d48.tv_nsec = 20000000;
      }
      local_d48.tv_sec = 0;
      nanosleep(&local_d48,(timespec *)0x0);
      iVar9 = gettimeofday(&local_d18,(__timezone_ptr_t)0x0);
      lVar19 = local_d20;
      if (iVar9 != 0) {
        local_d18.tv_sec = 0;
        local_d18.tv_usec = 0;
      }
      if (local_a38.bMedianFilter != 0) {
        pdVar16 = local_bb8 + 0x10;
        pdVar18 = local_bb8;
        for (lVar11 = 0x10; lVar11 != 0; lVar11 = lVar11 + -1) {
          *pdVar18 = *pdVar16;
          pdVar16 = pdVar16 + (ulong)bVar20 * -2 + 1;
          pdVar18 = pdVar18 + (ulong)bVar20 * -2 + 1;
        }
        pdVar16 = local_bb8 + 0x20;
        pdVar18 = local_bb8 + 0x10;
        for (lVar11 = 0x10; lVar11 != 0; lVar11 = lVar11 + -1) {
          *pdVar18 = *pdVar16;
          pdVar16 = pdVar16 + (ulong)bVar20 * -2 + 1;
          pdVar18 = pdVar18 + (ulong)bVar20 * -2 + 1;
        }
        pdVar16 = local_d08;
        pdVar18 = local_bb8 + 0x20;
        for (lVar11 = 0x10; lVar11 != 0; lVar11 = lVar11 + -1) {
          *pdVar18 = *pdVar16;
          pdVar16 = pdVar16 + (ulong)bVar20 * -2 + 1;
          pdVar18 = pdVar18 + (ulong)bVar20 * -2 + 1;
        }
        lVar11 = 0;
        do {
          local_d48.tv_sec = (__time_t)local_bb8[lVar11 + 0x20];
          local_d48.tv_nsec = (long)local_bb8[lVar11 + 0x10];
          local_d38 = local_bb8[lVar11];
          lVar12 = 1;
          lVar14 = 0;
          lVar13 = lVar12;
          do {
            do {
              dVar2 = (double)(&local_d48.tv_sec)[lVar14];
              if ((double)(&local_d48.tv_sec)[lVar12] < dVar2) {
                (&local_d48.tv_sec)[lVar14] = (&local_d48.tv_sec)[lVar12];
                (&local_d48.tv_sec)[lVar12] = (__time_t)dVar2;
              }
              lVar12 = lVar12 + 1;
            } while (lVar12 != 3);
            lVar14 = lVar14 + 1;
            lVar12 = lVar13 + 1;
            lVar13 = lVar12;
          } while (lVar14 != 2);
          local_d08[lVar11] = (double)local_d48.tv_nsec;
          lVar11 = lVar11 + 1;
        } while (lVar11 != 5);
      }
      pthread_mutex_lock((pthread_mutex_t *)&StateVariablesCS);
      dVar3 = local_a38.x[0];
      dVar5 = local_d08[0];
      dVar2 = cos(local_a38.psi[0]);
      dVar4 = local_a38.y[0];
      dVar3 = dVar2 * dVar5 + dVar3;
      local_d30 = local_d08[0];
      dVar2 = sin(local_a38.psi[0]);
      dVar4 = dVar2 * local_d30 + dVar4;
      local_c38 = atan2(dVar4,dVar3);
      dVar5 = local_a38.x[1];
      dVar8 = local_d08[1];
      local_d08[0] = SQRT(dVar4 * dVar4 + dVar3 * dVar3);
      dVar2 = cos(local_a38.psi[1]);
      dVar3 = local_a38.y[1];
      dVar5 = dVar2 * dVar8 + dVar5;
      local_d30 = local_d08[1];
      dVar2 = sin(local_a38.psi[1]);
      dVar3 = dVar2 * local_d30 + dVar3;
      dStack_c30 = atan2(dVar3,dVar5);
      dVar4 = local_a38.x[2];
      dVar8 = local_d08[2];
      local_d08[1] = SQRT(dVar3 * dVar3 + dVar5 * dVar5);
      dVar2 = cos(local_a38.psi[2]);
      dVar3 = local_a38.y[2];
      dVar4 = dVar2 * dVar8 + dVar4;
      local_d30 = local_d08[2];
      dVar2 = sin(local_a38.psi[2]);
      dVar3 = dVar2 * local_d30 + dVar3;
      local_c28 = atan2(dVar3,dVar4);
      dVar5 = local_a38.x[3];
      dVar8 = local_d08[3];
      local_d08[2] = SQRT(dVar3 * dVar3 + dVar4 * dVar4);
      dVar2 = cos(local_a38.psi[3]);
      dVar3 = local_a38.y[3];
      dVar5 = dVar2 * dVar8 + dVar5;
      local_d30 = local_d08[3];
      dVar2 = sin(local_a38.psi[3]);
      dVar3 = dVar2 * local_d30 + dVar3;
      dStack_c20 = atan2(dVar3,dVar5);
      local_d08[3] = SQRT(dVar3 * dVar3 + dVar5 * dVar5);
      distance_above = local_a38.z[4] + local_d08[4];
      tv.tv_usec = local_d18.tv_usec;
      tv.tv_sec = local_d18.tv_sec;
      set_htelemeters_vectors_SRF02(&local_c38,local_d08,4,tv);
      pthread_mutex_unlock((pthread_mutex_t *)&StateVariablesCS);
LAB_0019d5e2:
      bVar6 = true;
      bVar7 = false;
    }
    else {
      if (!bVar6) {
        puts("Restarting a SRF02.");
        iVar9 = close((int)local_a38.I2CBus);
        pcVar17 = "SRF02 disconnection failed.";
        if (iVar9 == 0) {
          pcVar17 = "SRF02 disconnected.";
        }
        puts(pcVar17);
      }
      bRestartSRF02 = 0;
LAB_0019cf13:
      iVar9 = ConnectSRF02(&local_a38,local_238);
      if (iVar9 == 0) {
        lVar19 = (long)local_a38.threadperiod;
        local_d48.tv_sec = (__time_t)(local_a38.threadperiod / 1000);
        local_d48.tv_nsec = (long)(((local_a38.threadperiod * 1000) % 1000000) * 1000);
        nanosleep(&local_d48,(timespec *)0x0);
        local_d18.tv_sec = 0;
        local_d18.tv_usec = 0;
        local_c38 = 0.0;
        dStack_c30 = 0.0;
        local_c28 = 0.0;
        dStack_c20 = 0.0;
        local_c18 = 0;
        uStack_c10 = 0;
        local_c08 = 0;
        uStack_c00 = 0;
        local_bf8 = 0;
        uStack_bf0 = 0;
        local_be8 = 0;
        uStack_be0 = 0;
        local_bd8 = 0;
        uStack_bd0 = 0;
        local_bc8 = 0;
        uStack_bc0 = 0;
        local_d08[0] = 0.0;
        local_d08[1] = 0.0;
        local_d08[2] = 0.0;
        local_d08[3] = 0.0;
        local_d08[4] = 0.0;
        local_d08[5] = 0.0;
        local_d08[6] = 0.0;
        local_d08[7] = 0.0;
        local_d08[8] = 0.0;
        local_d08[9] = 0.0;
        local_d08[10] = 0.0;
        local_d08[0xb] = 0.0;
        local_d08[0xc] = 0.0;
        local_d08[0xd] = 0.0;
        local_d08[0xe] = 0.0;
        local_d08[0xf] = 0.0;
        local_bb8[0x2e] = 0.0;
        local_bb8[0x2f] = 0.0;
        local_bb8[0x2c] = 0.0;
        local_bb8[0x2d] = 0.0;
        local_bb8[0x2a] = 0.0;
        local_bb8[0x2b] = 0.0;
        local_bb8[0x28] = 0.0;
        local_bb8[0x29] = 0.0;
        local_bb8[0x26] = 0.0;
        local_bb8[0x27] = 0.0;
        local_bb8[0x24] = 0.0;
        local_bb8[0x25] = 0.0;
        local_bb8[0x22] = 0.0;
        local_bb8[0x23] = 0.0;
        local_bb8[0x20] = 0.0;
        local_bb8[0x21] = 0.0;
        local_bb8[0x10] = 0.0;
        local_bb8[0x11] = 0.0;
        local_bb8[0x12] = 0.0;
        local_bb8[0x13] = 0.0;
        local_bb8[0x14] = 0.0;
        local_bb8[0x15] = 0.0;
        local_bb8[0x16] = 0.0;
        local_bb8[0x17] = 0.0;
        local_bb8[0x18] = 0.0;
        local_bb8[0x19] = 0.0;
        local_bb8[0x1a] = 0.0;
        local_bb8[0x1b] = 0.0;
        local_bb8[0x1c] = 0.0;
        local_bb8[0x1d] = 0.0;
        local_bb8[0x1e] = 0.0;
        local_bb8[0x1f] = 0.0;
        local_bb8[0] = 0.0;
        local_bb8[1] = 0.0;
        local_bb8[2] = 0.0;
        local_bb8[3] = 0.0;
        local_bb8[4] = 0.0;
        local_bb8[5] = 0.0;
        local_bb8[6] = 0.0;
        local_bb8[7] = 0.0;
        local_bb8[8] = 0.0;
        local_bb8[9] = 0.0;
        local_bb8[10] = 0.0;
        local_bb8[0xb] = 0.0;
        local_bb8[0xc] = 0.0;
        local_bb8[0xd] = 0.0;
        local_bb8[0xe] = 0.0;
        local_bb8[0xf] = 0.0;
        if ((FILE *)local_a38.pfSaveFile != (FILE *)0x0) {
          fclose((FILE *)local_a38.pfSaveFile);
          local_a38.pfSaveFile = (FILE *)0x0;
        }
        bVar6 = true;
        if (local_a38.bSaveRawData == 0) goto LAB_0019d5e2;
        if (local_a38.szCfgFilePath[0] == '\0') {
          builtin_strncpy(local_338,"srf02",6);
        }
        else {
          sprintf(local_338,"%.127s",local_a38.szCfgFilePath);
        }
        sVar10 = strlen(local_338);
        iVar9 = (int)sVar10 + 1;
        uVar15 = sVar10 & 0xffffffff;
        do {
          if ((int)uVar15 < 1) goto LAB_0019d646;
          uVar1 = uVar15 - 1;
          iVar9 = iVar9 + -1;
          lVar11 = uVar15 - 1;
          uVar15 = uVar1;
        } while (local_338[lVar11] != '.');
        if ((uVar1 != 0) && (iVar9 <= (int)sVar10)) {
          memset(local_338 + (uVar1 & 0xffffffff),0,sVar10 - (uVar1 & 0xffffffff));
        }
LAB_0019d646:
        pthread_mutex_lock((pthread_mutex_t *)&strtimeCS);
        pcVar17 = strtimeex_fns();
        bVar7 = false;
        sprintf(local_138,"log/%.127s_%.64s.txt",local_338,pcVar17);
        pthread_mutex_unlock((pthread_mutex_t *)&strtimeCS);
        local_a38.pfSaveFile = (FILE *)fopen(local_138,"wb");
        if ((FILE *)local_a38.pfSaveFile == (FILE *)0x0) {
          puts("Unable to create SRF02 data file.");
          bVar7 = false;
          break;
        }
      }
      else {
        local_d48.tv_sec = 1;
        local_d48.tv_nsec = 0;
        bVar6 = false;
        nanosleep(&local_d48,(timespec *)0x0);
        local_d24 = local_d24 + 1;
        bVar7 = true;
        lVar19 = local_d20;
        if (ExitOnErrorCount <= local_d24 && 0 < ExitOnErrorCount) {
          bExit = 1;
LAB_0019d6c6:
          bVar7 = true;
          break;
        }
      }
    }
  } while (bExit == 0);
  if (local_c40 == 0) {
    clock_gettime(4,&local_d48);
    local_c70 = (double)local_d48.tv_sec;
    dStack_c68 = (double)local_d48.tv_nsec;
    local_d48.tv_sec =
         ((local_d48.tv_sec + (long)local_c60) - local_c80.tv_sec) +
         (local_d48.tv_nsec + (long)dStack_c58) / 1000000000;
    local_d48.tv_nsec = (local_d48.tv_nsec + (long)dStack_c58) % 1000000000 - local_c80.tv_nsec;
    if (local_d48.tv_nsec < 0) {
      local_d48.tv_sec = local_d48.tv_sec + ~((ulong)-local_d48.tv_nsec / 1000000000);
      local_d48.tv_nsec =
           local_d48.tv_nsec + 1000000000 + ((ulong)-local_d48.tv_nsec / 1000000000) * 1000000000;
    }
    local_c60 = (double)local_d48.tv_sec;
    dStack_c58 = (double)local_d48.tv_nsec;
  }
  if ((FILE *)local_a38.pfSaveFile != (FILE *)0x0) {
    fclose((FILE *)local_a38.pfSaveFile);
    local_a38.pfSaveFile = (FILE *)0x0;
  }
  if (!bVar7) {
    iVar9 = close((int)local_a38.I2CBus);
    if (iVar9 == 0) {
      __s = "SRF02 disconnected.";
    }
    puts(__s);
  }
  if (bExit == 0) {
    bExit = 1;
  }
  return (void *)0x0;
}

Assistant:

THREAD_PROC_RETURN_VALUE SRF02Thread(void* pParam)
{
	SRF02 srf02;
	double x = 0, y = 0, z = 0;
	struct timeval tv;
	int nbhtelemeters = 0, nbvtelemeters = 0, nbtelemeters = 0;
	double angles[MAX_NB_DEVICES_SRF02];
	double distances[MAX_NB_DEVICES_SRF02];
	double distances1[MAX_NB_DEVICES_SRF02];
	double distances2[MAX_NB_DEVICES_SRF02];
	double distances3[MAX_NB_DEVICES_SRF02];
	BOOL bConnected = FALSE;
	CHRONO chrono_period;
	int threadperiod = 50;
	int errcount = 0;
	char szCfgFilePath[256];
	int i = 0;
	char szSaveFilePath[256];
	char szTemp[256];

	UNREFERENCED_PARAMETER(pParam);

	sprintf(szCfgFilePath, "SRF020.txt");

	memset(&srf02, 0, sizeof(SRF02));

	StartChrono(&chrono_period);

	for (;;)
	{
		StopChronoQuick(&chrono_period);
		StartChrono(&chrono_period);

		//uSleep(1000*threadperiod);

		if (bPauseSRF02) 
		{
			if (bConnected)
			{
				printf("SRF02 paused.\n");
				bConnected = FALSE;
				DisconnectSRF02(&srf02);
			}
			if (bExit) break;
			mSleep(100);
			continue;
		}

		if (bRestartSRF02) 
		{
			if (bConnected)
			{
				printf("Restarting a SRF02.\n");
				bConnected = FALSE;
				DisconnectSRF02(&srf02);
			}
			bRestartSRF02 = FALSE;
		}

		if (!bConnected)
		{
			if (ConnectSRF02(&srf02, szCfgFilePath) == EXIT_SUCCESS) 
			{
				bConnected = TRUE; 
				threadperiod = srf02.threadperiod;
				uSleep(1000*threadperiod);

				memset(&tv, 0, sizeof(tv));
				memset(angles, 0, sizeof(angles));
				memset(distances, 0, sizeof(distances));
				memset(distances1, 0, sizeof(distances1));
				memset(distances2, 0, sizeof(distances2));
				memset(distances3, 0, sizeof(distances3));

				if (srf02.pfSaveFile != NULL)
				{
					fclose(srf02.pfSaveFile); 
					srf02.pfSaveFile = NULL;
				}
				if ((srf02.bSaveRawData)&&(srf02.pfSaveFile == NULL)) 
				{
					if (strlen(srf02.szCfgFilePath) > 0)
					{
						sprintf(szTemp, "%.127s", srf02.szCfgFilePath);
					}
					else
					{
						sprintf(szTemp, "srf02");
					}
					// Remove the extension.
					for (i = (int)strlen(szTemp)-1; i >= 0; i--) { if (szTemp[i] == '.') break; }
					if ((i > 0)&&(i < (int)strlen(szTemp))) memset(szTemp+i, 0, strlen(szTemp)-i);
					//if (strlen(szTemp) > 4) memset(szTemp+strlen(szTemp)-4, 0, 4);
					EnterCriticalSection(&strtimeCS);
					sprintf(szSaveFilePath, LOG_FOLDER"%.127s_%.64s.txt", szTemp, strtimeex_fns());
					LeaveCriticalSection(&strtimeCS);
					srf02.pfSaveFile = fopen(szSaveFilePath, "wb");
					if (srf02.pfSaveFile == NULL) 
					{
						printf("Unable to create SRF02 data file.\n");
						break;
					}
				}
			}
			else 
			{
				bConnected = FALSE;
				mSleep(1000);
			}
		}
		else
		{
			//if ((srf02.telem1chan != -1)&&(srf02.telem2chan != -1)&&(srf02.telem3chan != -1)&&(srf02.telem4chan != -1)&&
			//	(srf02.telem5chan != -1))
			{
				// Assume 4 planar+1 up vertical telemeters...
				nbhtelemeters = 4; nbvtelemeters = 1; nbtelemeters = nbhtelemeters+nbvtelemeters;
				if (srf02.bParallel)
				{
					if (Get5TelemetersParallelSRF02(&srf02, &distances[0], &distances[1], &distances[2], &distances[3], &distances[4]) != EXIT_SUCCESS)
					{
						printf("Connection to a SRF02 lost.\n");
						bConnected = FALSE;
						DisconnectSRF02(&srf02);
						uSleep(1000*threadperiod);
						continue;
					}
					mSleep(20);
				}
				else
				{
					if (Get5TelemetersSRF02(&srf02, &distances[0], &distances[1], &distances[2], &distances[3], &distances[4], 10) != EXIT_SUCCESS)
					{
						printf("Connection to a SRF02 lost.\n");
						bConnected = FALSE;
						DisconnectSRF02(&srf02);
						uSleep(1000*threadperiod);
						continue;
					}
					mSleep(10);
				}
				if (gettimeofday(&tv, NULL) != EXIT_SUCCESS) { tv.tv_sec = 0; tv.tv_usec = 0; }
				if (srf02.bMedianFilter)
				{
					// Median filter with the 3 last values.
					memcpy(distances3, distances2, sizeof(distances));
					memcpy(distances2, distances1, sizeof(distances));
					memcpy(distances1, distances, sizeof(distances));
					for (i = 0; i < nbtelemeters; i++)
					{
						double tab_values[3] = { distances1[i], distances2[i], distances3[i] };					
						distances[i] = median(tab_values, 3);
					}
				}
				//printf("%f %f %f %f %f\n", distances[0], distances[1], distances[2], distances[3], distances[4]);
				EnterCriticalSection(&StateVariablesCS);
				i = 0;
				x = srf02.x[i]+distances[i]*cos(srf02.psi[i]); y = srf02.y[i]+distances[i]*sin(srf02.psi[i]);
				angles[i] = atan2(y, x); distances[i] = sqrt(sqr(x)+sqr(y));
				i = 1;
				x = srf02.x[i]+distances[i]*cos(srf02.psi[i]); y = srf02.y[i]+distances[i]*sin(srf02.psi[i]);
				angles[i] = atan2(y, x); distances[i] = sqrt(sqr(x)+sqr(y));
				i = 2;
				x = srf02.x[i]+distances[i]*cos(srf02.psi[i]); y = srf02.y[i]+distances[i]*sin(srf02.psi[i]);
				angles[i] = atan2(y, x); distances[i] = sqrt(sqr(x)+sqr(y));
				i = 3;
				x = srf02.x[i]+distances[i]*cos(srf02.psi[i]); y = srf02.y[i]+distances[i]*sin(srf02.psi[i]);
				angles[i] = atan2(y, x); distances[i] = sqrt(sqr(x)+sqr(y));

				// Up vertical...
				i = 4;
				z = srf02.z[i]+distances[i];
				distance_above = z;

				set_htelemeters_vectors_SRF02(angles, distances, nbhtelemeters, tv);
				LeaveCriticalSection(&StateVariablesCS);
			}
			//else uSleep(1000*threadperiod);
		}

		//printf("SRF02Thread period : %f s.\n", GetTimeElapsedChronoQuick(&chrono_period));
		if (!bConnected) { errcount++; if ((ExitOnErrorCount > 0)&&(errcount >= ExitOnErrorCount)) bExit = TRUE; }
		if (bExit) break;
	}
	
	StopChronoQuick(&chrono_period);

	if (srf02.pfSaveFile != NULL)
	{
		fclose(srf02.pfSaveFile); 
		srf02.pfSaveFile = NULL;
	}

	if (bConnected) DisconnectSRF02(&srf02);

	if (!bExit) bExit = TRUE; // Unexpected program exit...

	return 0;
}